

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveLright2(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *vec,int *ridx,int *rn,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *vec2,int *ridx2,int *rn2,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *eps2)

{
  uint *puVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  fpclass_type fVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  int *piVar13;
  ulong uVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_478;
  ulong local_440;
  cpp_dec_float<50U,_int,_void> local_438;
  int *local_400;
  ulong local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f0;
  cpp_dec_float<50U,_int,_void> local_3e8;
  ulong local_3b0;
  int *local_3a8;
  pointer local_3a0;
  int *local_398;
  int *local_390;
  int *local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_380;
  cpp_dec_float<50U,_int,_void> local_378;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_338;
  ulong local_330;
  cpp_dec_float<50U,_int,_void> local_328;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2a8;
  cpp_dec_float<50U,_int,_void> local_268;
  cpp_dec_float<50U,_int,_void> local_228;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_3e8.fpclass = cpp_dec_float_finite;
  local_3e8.prec_elem = 10;
  local_3e8.data._M_elems[0] = 0;
  local_3e8.data._M_elems[1] = 0;
  local_3e8.data._M_elems[2] = 0;
  local_3e8.data._M_elems[3] = 0;
  local_3e8.data._M_elems[4] = 0;
  local_3e8.data._M_elems[5] = 0;
  local_3e8.data._M_elems._24_5_ = 0;
  local_3e8.data._M_elems[7]._1_3_ = 0;
  local_3e8.data._M_elems[8] = 0;
  local_3e8.data._M_elems[9] = 0;
  local_3e8.exp = 0;
  local_3e8.neg = false;
  local_438.fpclass = cpp_dec_float_finite;
  local_438.prec_elem = 10;
  local_438.data._M_elems[0] = 0;
  local_438.data._M_elems[1] = 0;
  local_438.data._M_elems[2] = 0;
  local_438.data._M_elems[3] = 0;
  local_438.data._M_elems[4] = 0;
  local_438.data._M_elems[5] = 0;
  local_438.data._M_elems._24_5_ = 0;
  local_438.data._M_elems[7]._1_3_ = 0;
  local_438.data._M_elems[8] = 0;
  local_438.data._M_elems[9] = 0;
  local_438.exp = 0;
  local_438.neg = false;
  local_3a0 = (this->l).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_3a8 = (this->l).idx;
  local_388 = (this->l).row;
  local_400 = (this->l).start;
  local_330 = (ulong)(this->l).firstUpdate;
  local_3f0 = vec;
  local_398 = ridx;
  local_390 = rn;
  local_380 = eps;
  if ((long)local_330 < 1) {
    uVar14 = 0;
  }
  else {
    uVar14 = 0;
    local_338 = this;
    do {
      iVar8 = local_388[uVar14];
      local_438.data._M_elems._32_8_ = *(undefined8 *)(vec2[iVar8].m_backend.data._M_elems + 8);
      local_438.data._M_elems._0_8_ = *(undefined8 *)vec2[iVar8].m_backend.data._M_elems;
      local_438.data._M_elems._8_8_ = *(undefined8 *)(vec2[iVar8].m_backend.data._M_elems + 2);
      puVar1 = vec2[iVar8].m_backend.data._M_elems + 4;
      local_438.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_438.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_438.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_438.exp = vec2[iVar8].m_backend.exp;
      local_438.neg = vec2[iVar8].m_backend.neg;
      local_438.fpclass = vec2[iVar8].m_backend.fpclass;
      local_438.prec_elem = vec2[iVar8].m_backend.prec_elem;
      local_3e8.data._M_elems._0_8_ = *(undefined8 *)local_3f0[iVar8].m_backend.data._M_elems;
      local_3e8.data._M_elems._8_8_ = *(undefined8 *)(local_3f0[iVar8].m_backend.data._M_elems + 2);
      puVar1 = local_3f0[iVar8].m_backend.data._M_elems + 4;
      local_3e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_3e8.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_3e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_3e8.data._M_elems._32_8_ = *(undefined8 *)(local_3f0[iVar8].m_backend.data._M_elems + 8)
      ;
      local_478.exp = local_3f0[iVar8].m_backend.exp;
      local_3e8.neg = local_3f0[iVar8].m_backend.neg;
      local_3e8.fpclass = local_3f0[iVar8].m_backend.fpclass;
      local_3e8.prec_elem = local_3f0[iVar8].m_backend.prec_elem;
      local_478.data._M_elems._32_8_ = *(undefined8 *)(local_3f0[iVar8].m_backend.data._M_elems + 8)
      ;
      local_478.data._M_elems._0_8_ = *(undefined8 *)local_3f0[iVar8].m_backend.data._M_elems;
      local_478.data._M_elems._8_8_ = *(undefined8 *)(local_3f0[iVar8].m_backend.data._M_elems + 2);
      puVar1 = local_3f0[iVar8].m_backend.data._M_elems + 4;
      local_478.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_68.data._M_elems._0_8_ = *(undefined8 *)(local_380->m_backend).data._M_elems;
      local_68.data._M_elems._8_8_ = *(undefined8 *)((local_380->m_backend).data._M_elems + 2);
      local_68.data._M_elems._16_8_ = *(undefined8 *)((local_380->m_backend).data._M_elems + 4);
      local_68.data._M_elems._24_8_ = *(undefined8 *)((local_380->m_backend).data._M_elems + 6);
      local_68.data._M_elems._32_8_ = *(undefined8 *)((local_380->m_backend).data._M_elems + 8);
      local_68.exp = (local_380->m_backend).exp;
      local_68.neg = (local_380->m_backend).neg;
      local_68.fpclass = (local_380->m_backend).fpclass;
      local_68.prec_elem = (local_380->m_backend).prec_elem;
      local_478.prec_elem = local_3e8.prec_elem;
      local_478.fpclass = local_3e8.fpclass;
      local_478.neg = local_3e8.neg;
      if ((local_3e8.neg == true) &&
         (local_478.data._M_elems[0] != 0 || local_3e8.fpclass != cpp_dec_float_finite)) {
        local_478.neg = false;
      }
      local_3f8 = uVar14;
      local_3e8.exp = local_478.exp;
      if ((local_68.fpclass == cpp_dec_float_NaN || local_3e8.fpclass == cpp_dec_float_NaN) ||
         (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_478,&local_68), iVar8 < 1)) {
        local_478.data._M_elems[8] = local_438.data._M_elems[8];
        local_478.data._M_elems[9] = local_438.data._M_elems[9];
        local_478.data._M_elems[4] = local_438.data._M_elems[4];
        local_478.data._M_elems[5] = local_438.data._M_elems[5];
        local_478.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
        local_478.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
        local_478.data._M_elems[2] = local_438.data._M_elems[2];
        local_478.data._M_elems[3] = local_438.data._M_elems[3];
        local_478.data._M_elems[0] = local_438.data._M_elems[0];
        local_478.data._M_elems[1] = local_438.data._M_elems[1];
        auVar4 = (undefined1  [16])local_478.data._M_elems._0_16_;
        local_e8.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_e8.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_e8.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_e8.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_e8.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_e8.exp = (eps2->m_backend).exp;
        local_e8.neg = (eps2->m_backend).neg;
        local_e8.fpclass = (eps2->m_backend).fpclass;
        local_e8.prec_elem = (eps2->m_backend).prec_elem;
        local_478.exp = local_438.exp;
        local_478.neg = local_438.neg;
        local_478.fpclass = local_438.fpclass;
        local_478.prec_elem = local_438.prec_elem;
        if ((local_438.neg == true) &&
           (local_478.data._M_elems[0] = local_438.data._M_elems[0],
           local_478.data._M_elems[0] != 0 || local_438.fpclass != cpp_dec_float_finite)) {
          local_478.neg = false;
        }
        if ((local_e8.fpclass != cpp_dec_float_NaN && local_438.fpclass != cpp_dec_float_NaN) &&
           (local_478.data._M_elems._0_16_ = auVar4,
           iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_478,&local_e8), 0 < iVar8)) {
          local_440 = (ulong)local_400[local_3f8];
          iVar8 = local_400[local_3f8 + 1];
          if (local_400[local_3f8] < iVar8) {
            pcVar15 = &local_3a0[local_440].m_backend;
            piVar13 = local_3a8 + local_440;
            do {
              iVar10 = *piVar13;
              local_2e8.fpclass = cpp_dec_float_finite;
              local_2e8.prec_elem = 10;
              local_2e8.data._M_elems[0] = 0;
              local_2e8.data._M_elems[1] = 0;
              local_2e8.data._M_elems[2] = 0;
              local_2e8.data._M_elems[3] = 0;
              local_2e8.data._M_elems[4] = 0;
              local_2e8.data._M_elems[5] = 0;
              local_2e8.data._M_elems._24_5_ = 0;
              local_2e8.data._M_elems[7]._1_3_ = 0;
              local_2e8.data._M_elems[8] = 0;
              local_2e8.data._M_elems[9] = 0;
              local_2e8.exp = 0;
              local_2e8.neg = false;
              pcVar12 = &local_438;
              if (pcVar15 != &local_2e8) {
                local_2e8.data._M_elems[8] = local_438.data._M_elems[8];
                local_2e8.data._M_elems[9] = local_438.data._M_elems[9];
                local_2e8.data._M_elems[4] = local_438.data._M_elems[4];
                local_2e8.data._M_elems[5] = local_438.data._M_elems[5];
                local_2e8.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
                local_2e8.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
                local_2e8.data._M_elems[2] = local_438.data._M_elems[2];
                local_2e8.data._M_elems[3] = local_438.data._M_elems[3];
                local_2e8.data._M_elems[0] = local_438.data._M_elems[0];
                local_2e8.data._M_elems[1] = local_438.data._M_elems[1];
                local_2e8.exp = local_438.exp;
                local_2e8.neg = local_438.neg;
                local_2e8.fpclass = local_438.fpclass;
                local_2e8.prec_elem = local_438.prec_elem;
                pcVar12 = pcVar15;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_2e8,pcVar12);
              pcVar12 = &vec2[iVar10].m_backend;
              if (vec2[iVar10].m_backend.fpclass != cpp_dec_float_NaN) {
                local_478.fpclass = cpp_dec_float_finite;
                local_478.prec_elem = 10;
                local_478.data._M_elems[0] = 0;
                local_478.data._M_elems[1] = 0;
                local_478.data._M_elems[2] = 0;
                local_478.data._M_elems[3] = 0;
                local_478.data._M_elems[4] = 0;
                local_478.data._M_elems[5] = 0;
                local_478.data._M_elems._24_5_ = 0;
                local_478.data._M_elems[7]._1_3_ = 0;
                local_478.data._M_elems[8] = 0;
                local_478.data._M_elems[9] = 0;
                local_478.exp = 0;
                local_478.neg = false;
                pcVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
                local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
                local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
                local_478.exp = pcVar11->exp;
                local_478.neg = pcVar11->neg;
                local_478.fpclass = pcVar11->fpclass;
                local_478.prec_elem = pcVar11->prec_elem;
                iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (pcVar12,&local_478);
                if (iVar9 == 0) {
                  ridx2[*rn2] = iVar10;
                  *rn2 = *rn2 + 1;
                }
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (pcVar12,&local_2e8);
              if (pcVar12->fpclass != cpp_dec_float_NaN) {
                local_478.fpclass = cpp_dec_float_finite;
                local_478.prec_elem = 10;
                local_478.data._M_elems[0] = 0;
                local_478.data._M_elems[1] = 0;
                local_478.data._M_elems[2] = 0;
                local_478.data._M_elems[3] = 0;
                local_478.data._M_elems[4] = 0;
                local_478.data._M_elems[5] = 0;
                local_478.data._M_elems._24_5_ = 0;
                local_478.data._M_elems[7]._1_3_ = 0;
                local_478.data._M_elems[8] = 0;
                local_478.data._M_elems[9] = 0;
                local_478.exp = 0;
                local_478.neg = false;
                pcVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
                local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
                local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
                local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
                local_478.exp = pcVar11->exp;
                local_478.neg = pcVar11->neg;
                local_478.fpclass = pcVar11->fpclass;
                local_478.prec_elem = pcVar11->prec_elem;
                iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar12,&local_478);
                if (iVar10 == 0) {
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)pcVar12,1e-100);
                }
              }
              piVar13 = piVar13 + 1;
              pcVar15 = pcVar15 + 1;
              iVar8 = iVar8 + -1;
            } while ((int)local_440 < iVar8);
          }
        }
      }
      else {
        local_440 = (ulong)local_400[uVar14];
        local_478.data._M_elems[8] = local_438.data._M_elems[8];
        local_478.data._M_elems[9] = local_438.data._M_elems[9];
        local_478.data._M_elems[4] = local_438.data._M_elems[4];
        local_478.data._M_elems[5] = local_438.data._M_elems[5];
        local_478.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
        local_478.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
        local_478.data._M_elems[2] = local_438.data._M_elems[2];
        local_478.data._M_elems[3] = local_438.data._M_elems[3];
        local_478.data._M_elems[0] = local_438.data._M_elems[0];
        local_478.data._M_elems[1] = local_438.data._M_elems[1];
        auVar4 = (undefined1  [16])local_478.data._M_elems._0_16_;
        local_a8.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
        local_a8.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
        local_a8.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
        local_a8.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
        local_a8.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
        local_a8.exp = (eps2->m_backend).exp;
        local_a8.neg = (eps2->m_backend).neg;
        local_a8.fpclass = (eps2->m_backend).fpclass;
        local_a8.prec_elem = (eps2->m_backend).prec_elem;
        local_478.exp = local_438.exp;
        local_478.neg = local_438.neg;
        local_478.fpclass = local_438.fpclass;
        local_478.prec_elem = local_438.prec_elem;
        if ((local_438.neg == true) &&
           (local_478.data._M_elems[0] = local_438.data._M_elems[0],
           local_478.data._M_elems[0] != 0 || local_438.fpclass != cpp_dec_float_finite)) {
          local_478.neg = false;
        }
        piVar13 = local_3a8 + local_440;
        pcVar15 = &local_3a0[local_440].m_backend;
        local_478.data._M_elems._0_16_ = auVar4;
        if ((local_a8.fpclass == cpp_dec_float_NaN || local_438.fpclass == cpp_dec_float_NaN) ||
           (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_478,&local_a8), iVar8 < 1)) {
          for (iVar8 = local_400[uVar14 + 1]; (int)local_440 < iVar8; iVar8 = iVar8 + -1) {
            iVar10 = *piVar13;
            local_2a8.fpclass = cpp_dec_float_finite;
            local_2a8.prec_elem = 10;
            local_2a8.data._M_elems[0] = 0;
            local_2a8.data._M_elems[1] = 0;
            local_2a8.data._M_elems[2] = 0;
            local_2a8.data._M_elems[3] = 0;
            local_2a8.data._M_elems[4] = 0;
            local_2a8.data._M_elems[5] = 0;
            local_2a8.data._M_elems._24_5_ = 0;
            local_2a8.data._M_elems[7]._1_3_ = 0;
            local_2a8.data._M_elems[8] = 0;
            local_2a8.data._M_elems[9] = 0;
            local_2a8.exp = 0;
            local_2a8.neg = false;
            pcVar12 = &local_3e8;
            if (pcVar15 != &local_2a8) {
              local_2a8.data._M_elems[8] = local_3e8.data._M_elems[8];
              local_2a8.data._M_elems[9] = local_3e8.data._M_elems[9];
              local_2a8.data._M_elems[4] = local_3e8.data._M_elems[4];
              local_2a8.data._M_elems[5] = local_3e8.data._M_elems[5];
              local_2a8.data._M_elems._24_5_ = local_3e8.data._M_elems._24_5_;
              local_2a8.data._M_elems[7]._1_3_ = local_3e8.data._M_elems[7]._1_3_;
              local_2a8.data._M_elems[2] = local_3e8.data._M_elems[2];
              local_2a8.data._M_elems[3] = local_3e8.data._M_elems[3];
              local_2a8.data._M_elems[0] = local_3e8.data._M_elems[0];
              local_2a8.data._M_elems[1] = local_3e8.data._M_elems[1];
              local_2a8.exp = local_3e8.exp;
              local_2a8.neg = local_3e8.neg;
              local_2a8.fpclass = local_3e8.fpclass;
              local_2a8.prec_elem = local_3e8.prec_elem;
              pcVar12 = pcVar15;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_2a8,pcVar12);
            pcVar12 = &local_3f0[iVar10].m_backend;
            if (local_3f0[iVar10].m_backend.fpclass != cpp_dec_float_NaN) {
              local_478.fpclass = cpp_dec_float_finite;
              local_478.prec_elem = 10;
              local_478.data._M_elems[0] = 0;
              local_478.data._M_elems[1] = 0;
              local_478.data._M_elems[2] = 0;
              local_478.data._M_elems[3] = 0;
              local_478.data._M_elems[4] = 0;
              local_478.data._M_elems[5] = 0;
              local_478.data._M_elems._24_5_ = 0;
              local_478.data._M_elems[7]._1_3_ = 0;
              local_478.data._M_elems[8] = 0;
              local_478.data._M_elems[9] = 0;
              local_478.exp = 0;
              local_478.neg = false;
              pcVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
              local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
              local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
              local_478.exp = pcVar11->exp;
              local_478.neg = pcVar11->neg;
              local_478.fpclass = pcVar11->fpclass;
              local_478.prec_elem = pcVar11->prec_elem;
              iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (pcVar12,&local_478);
              if (iVar9 == 0) {
                local_398[*local_390] = iVar10;
                *local_390 = *local_390 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (pcVar12,&local_2a8);
            if (pcVar12->fpclass != cpp_dec_float_NaN) {
              local_478.fpclass = cpp_dec_float_finite;
              local_478.prec_elem = 10;
              local_478.data._M_elems[0] = 0;
              local_478.data._M_elems[1] = 0;
              local_478.data._M_elems[2] = 0;
              local_478.data._M_elems[3] = 0;
              local_478.data._M_elems[4] = 0;
              local_478.data._M_elems[5] = 0;
              local_478.data._M_elems._24_5_ = 0;
              local_478.data._M_elems[7]._1_3_ = 0;
              local_478.data._M_elems[8] = 0;
              local_478.data._M_elems[9] = 0;
              local_478.exp = 0;
              local_478.neg = false;
              pcVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
              local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
              local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
              local_478.exp = pcVar11->exp;
              local_478.neg = pcVar11->neg;
              local_478.fpclass = pcVar11->fpclass;
              local_478.prec_elem = pcVar11->prec_elem;
              iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar12,&local_478);
              if (iVar10 == 0) {
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)pcVar12,1e-100);
              }
            }
            piVar13 = piVar13 + 1;
            pcVar15 = pcVar15 + 1;
          }
        }
        else {
          for (iVar8 = local_400[uVar14 + 1]; (int)local_440 < iVar8; iVar8 = iVar8 + -1) {
            iVar10 = *piVar13;
            local_228.fpclass = cpp_dec_float_finite;
            local_228.prec_elem = 10;
            local_228.data._M_elems[0] = 0;
            local_228.data._M_elems[1] = 0;
            local_228.data._M_elems[2] = 0;
            local_228.data._M_elems[3] = 0;
            local_228.data._M_elems[4] = 0;
            local_228.data._M_elems[5] = 0;
            local_228.data._M_elems._24_5_ = 0;
            local_228.data._M_elems[7]._1_3_ = 0;
            local_228.data._M_elems[8] = 0;
            local_228.data._M_elems[9] = 0;
            local_228.exp = 0;
            local_228.neg = false;
            pcVar12 = &local_3e8;
            if (pcVar15 != &local_228) {
              local_228.data._M_elems[8] = local_3e8.data._M_elems[8];
              local_228.data._M_elems[9] = local_3e8.data._M_elems[9];
              local_228.data._M_elems[4] = local_3e8.data._M_elems[4];
              local_228.data._M_elems[5] = local_3e8.data._M_elems[5];
              local_228.data._M_elems._24_5_ = local_3e8.data._M_elems._24_5_;
              local_228.data._M_elems[7]._1_3_ = local_3e8.data._M_elems[7]._1_3_;
              local_228.data._M_elems[2] = local_3e8.data._M_elems[2];
              local_228.data._M_elems[3] = local_3e8.data._M_elems[3];
              local_228.data._M_elems[0] = local_3e8.data._M_elems[0];
              local_228.data._M_elems[1] = local_3e8.data._M_elems[1];
              local_228.exp = local_3e8.exp;
              local_228.neg = local_3e8.neg;
              local_228.fpclass = local_3e8.fpclass;
              local_228.prec_elem = local_3e8.prec_elem;
              pcVar12 = pcVar15;
            }
            local_3b0 = CONCAT44(local_3b0._4_4_,iVar10);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_228,pcVar12);
            pcVar12 = &local_3f0[iVar10].m_backend;
            if (local_3f0[iVar10].m_backend.fpclass != cpp_dec_float_NaN) {
              local_478.fpclass = cpp_dec_float_finite;
              local_478.prec_elem = 10;
              local_478.data._M_elems[0] = 0;
              local_478.data._M_elems[1] = 0;
              local_478.data._M_elems[2] = 0;
              local_478.data._M_elems[3] = 0;
              local_478.data._M_elems[4] = 0;
              local_478.data._M_elems[5] = 0;
              local_478.data._M_elems._24_5_ = 0;
              local_478.data._M_elems[7]._1_3_ = 0;
              local_478.data._M_elems[8] = 0;
              local_478.data._M_elems[9] = 0;
              local_478.exp = 0;
              local_478.neg = false;
              pcVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
              local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
              local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
              local_478.exp = pcVar11->exp;
              local_478.neg = pcVar11->neg;
              local_478.fpclass = pcVar11->fpclass;
              local_478.prec_elem = pcVar11->prec_elem;
              iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (pcVar12,&local_478);
              if (iVar9 == 0) {
                local_398[*local_390] = (int)local_3b0;
                *local_390 = *local_390 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (pcVar12,&local_228);
            if (pcVar12->fpclass != cpp_dec_float_NaN) {
              local_478.fpclass = cpp_dec_float_finite;
              local_478.prec_elem = 10;
              local_478.data._M_elems[0] = 0;
              local_478.data._M_elems[1] = 0;
              local_478.data._M_elems[2] = 0;
              local_478.data._M_elems[3] = 0;
              local_478.data._M_elems[4] = 0;
              local_478.data._M_elems[5] = 0;
              local_478.data._M_elems._24_5_ = 0;
              local_478.data._M_elems[7]._1_3_ = 0;
              local_478.data._M_elems[8] = 0;
              local_478.data._M_elems[9] = 0;
              local_478.exp = 0;
              local_478.neg = false;
              pcVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
              local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
              local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
              local_478.exp = pcVar11->exp;
              local_478.neg = pcVar11->neg;
              local_478.fpclass = pcVar11->fpclass;
              local_478.prec_elem = pcVar11->prec_elem;
              iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (pcVar12,&local_478);
              if (iVar9 == 0) {
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)pcVar12,1e-100);
              }
            }
            local_268.fpclass = cpp_dec_float_finite;
            local_268.prec_elem = 10;
            local_268.data._M_elems[0] = 0;
            local_268.data._M_elems[1] = 0;
            local_268.data._M_elems[2] = 0;
            local_268.data._M_elems[3] = 0;
            local_268.data._M_elems[4] = 0;
            local_268.data._M_elems[5] = 0;
            local_268.data._M_elems._24_5_ = 0;
            local_268.data._M_elems[7]._1_3_ = 0;
            local_268.data._M_elems[8] = 0;
            local_268.data._M_elems[9] = 0;
            local_268.exp = 0;
            local_268.neg = false;
            pcVar12 = &local_438;
            if (pcVar15 != &local_268) {
              local_268.data._M_elems[8] = local_438.data._M_elems[8];
              local_268.data._M_elems[9] = local_438.data._M_elems[9];
              local_268.data._M_elems[4] = local_438.data._M_elems[4];
              local_268.data._M_elems[5] = local_438.data._M_elems[5];
              local_268.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
              local_268.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
              local_268.data._M_elems[2] = local_438.data._M_elems[2];
              local_268.data._M_elems[3] = local_438.data._M_elems[3];
              local_268.data._M_elems[0] = local_438.data._M_elems[0];
              local_268.data._M_elems[1] = local_438.data._M_elems[1];
              local_268.exp = local_438.exp;
              local_268.neg = local_438.neg;
              local_268.fpclass = local_438.fpclass;
              local_268.prec_elem = local_438.prec_elem;
              pcVar12 = pcVar15;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_268,pcVar12);
            pcVar12 = &vec2[iVar10].m_backend;
            if (vec2[iVar10].m_backend.fpclass != cpp_dec_float_NaN) {
              local_478.fpclass = cpp_dec_float_finite;
              local_478.prec_elem = 10;
              local_478.data._M_elems[0] = 0;
              local_478.data._M_elems[1] = 0;
              local_478.data._M_elems[2] = 0;
              local_478.data._M_elems[3] = 0;
              local_478.data._M_elems[4] = 0;
              local_478.data._M_elems[5] = 0;
              local_478.data._M_elems._24_5_ = 0;
              local_478.data._M_elems[7]._1_3_ = 0;
              local_478.data._M_elems[8] = 0;
              local_478.data._M_elems[9] = 0;
              local_478.exp = 0;
              local_478.neg = false;
              pcVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
              local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
              local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
              local_478.exp = pcVar11->exp;
              local_478.neg = pcVar11->neg;
              local_478.fpclass = pcVar11->fpclass;
              local_478.prec_elem = pcVar11->prec_elem;
              iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar12,&local_478);
              if (iVar10 == 0) {
                ridx2[*rn2] = (int)local_3b0;
                *rn2 = *rn2 + 1;
              }
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (pcVar12,&local_268);
            if (pcVar12->fpclass != cpp_dec_float_NaN) {
              local_478.fpclass = cpp_dec_float_finite;
              local_478.prec_elem = 10;
              local_478.data._M_elems[0] = 0;
              local_478.data._M_elems[1] = 0;
              local_478.data._M_elems[2] = 0;
              local_478.data._M_elems[3] = 0;
              local_478.data._M_elems[4] = 0;
              local_478.data._M_elems[5] = 0;
              local_478.data._M_elems._24_5_ = 0;
              local_478.data._M_elems[7]._1_3_ = 0;
              local_478.data._M_elems[8] = 0;
              local_478.data._M_elems[9] = 0;
              local_478.exp = 0;
              local_478.neg = false;
              pcVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
              local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
              local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
              local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
              local_478.exp = pcVar11->exp;
              local_478.neg = pcVar11->neg;
              local_478.fpclass = pcVar11->fpclass;
              local_478.prec_elem = pcVar11->prec_elem;
              iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar12,&local_478);
              if (iVar10 == 0) {
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)pcVar12,1e-100);
              }
            }
            piVar13 = piVar13 + 1;
            pcVar15 = pcVar15 + 1;
          }
        }
      }
      uVar14 = local_3f8 + 1;
      this = local_338;
    } while (uVar14 != local_330);
  }
  if (((this->l).updateType != 0) &&
     (uVar2 = (this->l).firstUnused, local_3b0 = (ulong)uVar2, (int)uVar14 < (int)uVar2)) {
    local_440 = uVar14 & 0xffffffff;
    do {
      iVar8 = local_400[local_440];
      local_378.fpclass = cpp_dec_float_finite;
      local_378.prec_elem = 10;
      local_378.data._M_elems[0] = 0;
      local_378.data._M_elems[1] = 0;
      local_378.data._M_elems[2] = 0;
      local_378.data._M_elems[3] = 0;
      local_378.data._M_elems[4] = 0;
      local_378.data._M_elems[5] = 0;
      local_378.data._M_elems._24_5_ = 0;
      local_378.data._M_elems[7]._1_3_ = 0;
      local_378.data._M_elems[8] = 0;
      local_378.data._M_elems[9] = 0;
      local_378.exp = 0;
      local_378.neg = false;
      local_328.fpclass = cpp_dec_float_finite;
      local_328.prec_elem = 10;
      local_328.data._M_elems[0] = 0;
      local_328.data._M_elems[1] = 0;
      local_328.data._M_elems[2] = 0;
      local_328.data._M_elems[3] = 0;
      local_328.data._M_elems[4] = 0;
      local_328.data._M_elems[5] = 0;
      local_328.data._M_elems._24_5_ = 0;
      local_328.data._M_elems[7]._1_3_ = 0;
      local_328.data._M_elems[8] = 0;
      local_328.data._M_elems[9] = 0;
      local_328.exp = 0;
      local_328.neg = false;
      iVar10 = local_400[local_440 + 1];
      if (iVar8 < iVar10) {
        pcVar15 = &local_3a0[iVar8].m_backend;
        piVar13 = local_3a8 + iVar8;
        do {
          pcVar11 = &local_3f0[*piVar13].m_backend;
          local_478.fpclass = cpp_dec_float_finite;
          local_478.prec_elem = 10;
          local_478.data._M_elems[0] = 0;
          local_478.data._M_elems[1] = 0;
          local_478.data._M_elems[2] = 0;
          local_478.data._M_elems[3] = 0;
          local_478.data._M_elems[4] = 0;
          local_478.data._M_elems[5] = 0;
          local_478.data._M_elems._24_5_ = 0;
          local_478.data._M_elems[7]._1_3_ = 0;
          local_478.data._M_elems[8] = 0;
          local_478.data._M_elems[9] = 0;
          local_478.exp = 0;
          local_478.neg = false;
          pcVar12 = pcVar11;
          if ((pcVar15 != &local_478) && (pcVar12 = pcVar15, &local_478 != pcVar11)) {
            local_478.data._M_elems._32_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 8);
            local_478.data._M_elems._0_16_ =
                 *(undefined1 (*) [16])
                  (((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems;
            local_478.data._M_elems._16_8_ =
                 *(undefined8 *)
                  ((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 4);
            uVar3 = *(undefined8 *)
                     ((((cpp_dec_float<50U,_int,_void> *)&pcVar11->data)->data)._M_elems + 6);
            local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_478.exp = pcVar11->exp;
            local_478.neg = pcVar11->neg;
            local_478.fpclass = pcVar11->fpclass;
            local_478.prec_elem = pcVar11->prec_elem;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_478,pcVar12);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_378,&local_478);
          pcVar11 = &vec2[*piVar13].m_backend;
          local_478.fpclass = cpp_dec_float_finite;
          local_478.prec_elem = 10;
          local_478.data._M_elems[0] = 0;
          local_478.data._M_elems[1] = 0;
          local_478.data._M_elems[2] = 0;
          local_478.data._M_elems[3] = 0;
          local_478.data._M_elems[4] = 0;
          local_478.data._M_elems[5] = 0;
          local_478.data._M_elems._24_5_ = 0;
          local_478.data._M_elems[7]._1_3_ = 0;
          local_478.data._M_elems[8] = 0;
          local_478.data._M_elems[9] = 0;
          local_478.exp = 0;
          local_478.neg = false;
          pcVar12 = pcVar11;
          if ((pcVar15 != &local_478) && (pcVar12 = pcVar15, &local_478 != pcVar11)) {
            local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 8);
            local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar11->data)._M_elems;
            local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
            uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
            local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_478.exp = pcVar11->exp;
            local_478.neg = pcVar11->neg;
            local_478.fpclass = pcVar11->fpclass;
            local_478.prec_elem = pcVar11->prec_elem;
          }
          piVar13 = piVar13 + 1;
          pcVar15 = pcVar15 + 1;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&local_478,pcVar12);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (&local_328,&local_478);
          iVar10 = iVar10 + -1;
        } while (iVar8 < iVar10);
      }
      auVar7 = (undefined1  [16])local_328.data._M_elems._0_16_;
      auVar5 = (undefined1  [16])local_378.data._M_elems._0_16_;
      uVar14 = local_440;
      local_3e8.data._M_elems[8] = local_378.data._M_elems[8];
      local_3e8.data._M_elems[9] = local_378.data._M_elems[9];
      local_3e8.data._M_elems[4] = local_378.data._M_elems[4];
      local_3e8.data._M_elems[5] = local_378.data._M_elems[5];
      local_3e8.data._M_elems._24_5_ = local_378.data._M_elems._24_5_;
      local_3e8.data._M_elems[7]._1_3_ = local_378.data._M_elems[7]._1_3_;
      local_3e8.data._M_elems[0] = local_378.data._M_elems[0];
      local_3e8.data._M_elems[1] = local_378.data._M_elems[1];
      uVar3 = local_3e8.data._M_elems._0_8_;
      local_3e8.data._M_elems[0] = local_378.data._M_elems[0];
      local_3e8.data._M_elems[1] = local_378.data._M_elems[1];
      local_3e8.data._M_elems[2] = local_378.data._M_elems[2];
      local_3e8.data._M_elems[3] = local_378.data._M_elems[3];
      fVar6 = local_378.fpclass;
      local_3e8.exp = local_378.exp;
      local_3e8.neg = local_378.neg;
      local_3e8.fpclass = local_378.fpclass;
      local_3e8.prec_elem = local_378.prec_elem;
      local_438.data._M_elems[0] = local_328.data._M_elems[0];
      local_438.data._M_elems[1] = local_328.data._M_elems[1];
      local_438.data._M_elems[2] = local_328.data._M_elems[2];
      local_438.data._M_elems[3] = local_328.data._M_elems[3];
      local_438.data._M_elems[4] = local_328.data._M_elems[4];
      local_438.data._M_elems[5] = local_328.data._M_elems[5];
      local_438.data._M_elems._24_5_ = local_328.data._M_elems._24_5_;
      local_438.data._M_elems[7]._1_3_ = local_328.data._M_elems[7]._1_3_;
      local_438.data._M_elems[8] = local_328.data._M_elems[8];
      local_438.data._M_elems[9] = local_328.data._M_elems[9];
      local_438.exp = local_328.exp;
      local_438.neg = local_328.neg;
      local_438.fpclass = local_328.fpclass;
      local_438.prec_elem = local_328.prec_elem;
      iVar8 = local_388[local_440];
      local_478.data._M_elems[8] = local_378.data._M_elems[8];
      local_478.data._M_elems[9] = local_378.data._M_elems[9];
      local_478.data._M_elems[4] = local_378.data._M_elems[4];
      local_478.data._M_elems[5] = local_378.data._M_elems[5];
      local_478.data._M_elems._24_5_ = local_378.data._M_elems._24_5_;
      local_478.data._M_elems[7]._1_3_ = local_378.data._M_elems[7]._1_3_;
      local_378.data._M_elems[0] = auVar5._0_4_;
      local_378.data._M_elems[1] = auVar5._4_4_;
      local_378.data._M_elems[2] = auVar5._8_4_;
      local_378.data._M_elems[3] = auVar5._12_4_;
      local_478.data._M_elems[0] = local_378.data._M_elems[0];
      local_478.data._M_elems[1] = local_378.data._M_elems[1];
      local_478.data._M_elems[2] = local_378.data._M_elems[2];
      local_478.data._M_elems[3] = local_378.data._M_elems[3];
      auVar4 = (undefined1  [16])local_478.data._M_elems._0_16_;
      local_128.data._M_elems._0_8_ = *(undefined8 *)(local_380->m_backend).data._M_elems;
      local_128.data._M_elems._8_8_ = *(undefined8 *)((local_380->m_backend).data._M_elems + 2);
      local_128.data._M_elems._16_8_ = *(undefined8 *)((local_380->m_backend).data._M_elems + 4);
      local_128.data._M_elems._24_8_ = *(undefined8 *)((local_380->m_backend).data._M_elems + 6);
      local_128.data._M_elems._32_8_ = *(undefined8 *)((local_380->m_backend).data._M_elems + 8);
      local_128.exp = (local_380->m_backend).exp;
      local_128.neg = (local_380->m_backend).neg;
      local_128.fpclass = (local_380->m_backend).fpclass;
      local_128.prec_elem = (local_380->m_backend).prec_elem;
      local_478.exp = local_378.exp;
      local_478.neg = local_378.neg;
      local_478.fpclass = local_378.fpclass;
      local_478.prec_elem = local_378.prec_elem;
      if ((local_378.neg == true) &&
         (local_478.data._M_elems[0] = auVar5._0_4_,
         local_478.data._M_elems[0] != 0 || fVar6 != cpp_dec_float_finite)) {
        local_478.neg = false;
      }
      local_3f8 = CONCAT44(local_3f8._4_4_,iVar8);
      local_378.data._M_elems._0_16_ = auVar5;
      local_328.data._M_elems._0_16_ = auVar7;
      if ((local_128.fpclass != cpp_dec_float_NaN && fVar6 != cpp_dec_float_NaN) &&
         (local_478.data._M_elems._0_16_ = auVar4,
         iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_478,&local_128), uVar3 = local_3e8.data._M_elems._0_8_,
         0 < iVar10)) {
        local_168.data._M_elems[8] = local_3e8.data._M_elems[8];
        local_168.data._M_elems[9] = local_3e8.data._M_elems[9];
        local_168.data._M_elems[7]._1_3_ = local_3e8.data._M_elems[7]._1_3_;
        local_168.data._M_elems._24_5_ = local_3e8.data._M_elems._24_5_;
        local_168.data._M_elems[4] = local_3e8.data._M_elems[4];
        local_168.data._M_elems[5] = local_3e8.data._M_elems[5];
        local_168.data._M_elems[0] = local_3e8.data._M_elems[0];
        local_168.data._M_elems[1] = local_3e8.data._M_elems[1];
        local_168.data._M_elems[2] = local_3e8.data._M_elems[2];
        local_168.data._M_elems[3] = local_3e8.data._M_elems[3];
        local_168.exp = local_3e8.exp;
        local_168.neg = local_3e8.neg;
        local_168.fpclass = local_3e8.fpclass;
        local_168.prec_elem = local_3e8.prec_elem;
        pcVar15 = &local_3f0[iVar8].m_backend;
        if (local_3f0[iVar8].m_backend.fpclass != cpp_dec_float_NaN) {
          local_478.fpclass = cpp_dec_float_finite;
          local_478.prec_elem = 10;
          local_478.data._M_elems[0] = 0;
          local_478.data._M_elems[1] = 0;
          local_478.data._M_elems[2] = 0;
          local_478.data._M_elems[3] = 0;
          local_478.data._M_elems[4] = 0;
          local_478.data._M_elems[5] = 0;
          local_478.data._M_elems._24_5_ = 0;
          local_478.data._M_elems[7]._1_3_ = 0;
          local_478.data._M_elems[8] = 0;
          local_478.data._M_elems[9] = 0;
          local_478.exp = 0;
          local_478.neg = false;
          pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
          local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
          uVar3 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
          local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
          local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
          local_478.exp = pcVar12->exp;
          local_478.neg = pcVar12->neg;
          local_478.fpclass = pcVar12->fpclass;
          local_478.prec_elem = pcVar12->prec_elem;
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar15,&local_478);
          if (iVar10 == 0) {
            local_398[*local_390] = (int)local_3f8;
            *local_390 = *local_390 + 1;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (pcVar15,&local_168);
        uVar3 = local_3e8.data._M_elems._0_8_;
        if (pcVar15->fpclass != cpp_dec_float_NaN) {
          local_478.fpclass = cpp_dec_float_finite;
          local_478.prec_elem = 10;
          local_478.data._M_elems[0] = 0;
          local_478.data._M_elems[1] = 0;
          local_478.data._M_elems[2] = 0;
          local_478.data._M_elems[3] = 0;
          local_478.data._M_elems[4] = 0;
          local_478.data._M_elems[5] = 0;
          local_478.data._M_elems._24_5_ = 0;
          local_478.data._M_elems[7]._1_3_ = 0;
          local_478.data._M_elems[8] = 0;
          local_478.data._M_elems[9] = 0;
          local_478.exp = 0;
          local_478.neg = false;
          pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
          local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
          uVar3 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
          local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
          local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
          local_478.exp = pcVar12->exp;
          local_478.neg = pcVar12->neg;
          local_478.fpclass = pcVar12->fpclass;
          local_478.prec_elem = pcVar12->prec_elem;
          iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (pcVar15,&local_478);
          uVar3 = local_3e8.data._M_elems._0_8_;
          if (iVar10 == 0) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)pcVar15,1e-100);
            uVar3 = local_3e8.data._M_elems._0_8_;
          }
        }
      }
      local_3e8.data._M_elems._0_8_ = uVar3;
      local_478.data._M_elems[8] = local_438.data._M_elems[8];
      local_478.data._M_elems[9] = local_438.data._M_elems[9];
      local_478.data._M_elems[4] = local_438.data._M_elems[4];
      local_478.data._M_elems[5] = local_438.data._M_elems[5];
      local_478.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
      local_478.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
      local_478.data._M_elems[2] = local_438.data._M_elems[2];
      local_478.data._M_elems[3] = local_438.data._M_elems[3];
      local_478.data._M_elems[0] = local_438.data._M_elems[0];
      local_478.data._M_elems[1] = local_438.data._M_elems[1];
      auVar4 = (undefined1  [16])local_478.data._M_elems._0_16_;
      local_1a8.data._M_elems._0_8_ = *(undefined8 *)(eps2->m_backend).data._M_elems;
      local_1a8.data._M_elems._8_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 2);
      local_1a8.data._M_elems._16_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 4);
      local_1a8.data._M_elems._24_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 6);
      local_1a8.data._M_elems._32_8_ = *(undefined8 *)((eps2->m_backend).data._M_elems + 8);
      local_1a8.exp = (eps2->m_backend).exp;
      local_1a8.neg = (eps2->m_backend).neg;
      local_1a8.fpclass = (eps2->m_backend).fpclass;
      local_1a8.prec_elem = (eps2->m_backend).prec_elem;
      local_478.exp = local_438.exp;
      local_478.neg = local_438.neg;
      local_478.fpclass = local_438.fpclass;
      local_478.prec_elem = local_438.prec_elem;
      if ((local_438.neg == true) &&
         (local_478.data._M_elems[0] = local_438.data._M_elems[0],
         local_478.data._M_elems[0] != 0 || local_438.fpclass != cpp_dec_float_finite)) {
        local_478.neg = false;
      }
      if ((local_1a8.fpclass != cpp_dec_float_NaN && local_438.fpclass != cpp_dec_float_NaN) &&
         (local_478.data._M_elems._0_16_ = auVar4,
         iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_478,&local_1a8), 0 < iVar10)) {
        local_1e8.data._M_elems[8] = local_438.data._M_elems[8];
        local_1e8.data._M_elems[9] = local_438.data._M_elems[9];
        local_1e8.data._M_elems[7]._1_3_ = local_438.data._M_elems[7]._1_3_;
        local_1e8.data._M_elems._24_5_ = local_438.data._M_elems._24_5_;
        local_1e8.data._M_elems[4] = local_438.data._M_elems[4];
        local_1e8.data._M_elems[5] = local_438.data._M_elems[5];
        local_1e8.data._M_elems[0] = local_438.data._M_elems[0];
        local_1e8.data._M_elems[1] = local_438.data._M_elems[1];
        local_1e8.data._M_elems[2] = local_438.data._M_elems[2];
        local_1e8.data._M_elems[3] = local_438.data._M_elems[3];
        local_1e8.exp = local_438.exp;
        local_1e8.neg = local_438.neg;
        local_1e8.fpclass = local_438.fpclass;
        local_1e8.prec_elem = local_438.prec_elem;
        pcVar15 = &vec2[iVar8].m_backend;
        if (vec2[iVar8].m_backend.fpclass != cpp_dec_float_NaN) {
          local_478.fpclass = cpp_dec_float_finite;
          local_478.prec_elem = 10;
          local_478.data._M_elems[0] = 0;
          local_478.data._M_elems[1] = 0;
          local_478.data._M_elems[2] = 0;
          local_478.data._M_elems[3] = 0;
          local_478.data._M_elems[4] = 0;
          local_478.data._M_elems[5] = 0;
          local_478.data._M_elems._24_5_ = 0;
          local_478.data._M_elems[7]._1_3_ = 0;
          local_478.data._M_elems[8] = 0;
          local_478.data._M_elems[9] = 0;
          local_478.exp = 0;
          local_478.neg = false;
          pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
          local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
          uVar3 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
          local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
          local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
          local_478.exp = pcVar12->exp;
          local_478.neg = pcVar12->neg;
          local_478.fpclass = pcVar12->fpclass;
          local_478.prec_elem = pcVar12->prec_elem;
          iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar15,&local_478);
          if (iVar8 == 0) {
            ridx2[*rn2] = (int)local_3f8;
            *rn2 = *rn2 + 1;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (pcVar15,&local_1e8);
        if (pcVar15->fpclass != cpp_dec_float_NaN) {
          local_478.fpclass = cpp_dec_float_finite;
          local_478.prec_elem = 10;
          local_478.data._M_elems[0] = 0;
          local_478.data._M_elems[1] = 0;
          local_478.data._M_elems[2] = 0;
          local_478.data._M_elems[3] = 0;
          local_478.data._M_elems[4] = 0;
          local_478.data._M_elems[5] = 0;
          local_478.data._M_elems._24_5_ = 0;
          local_478.data._M_elems[7]._1_3_ = 0;
          local_478.data._M_elems[8] = 0;
          local_478.data._M_elems[9] = 0;
          local_478.exp = 0;
          local_478.neg = false;
          pcVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::zero();
          local_478.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar12->data)._M_elems;
          local_478.data._M_elems._16_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 4);
          uVar3 = *(undefined8 *)((pcVar12->data)._M_elems + 6);
          local_478.data._M_elems._24_5_ = SUB85(uVar3,0);
          local_478.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
          local_478.data._M_elems._32_8_ = *(undefined8 *)((pcVar12->data)._M_elems + 8);
          local_478.exp = pcVar12->exp;
          local_478.neg = pcVar12->neg;
          local_478.fpclass = pcVar12->fpclass;
          local_478.prec_elem = pcVar12->prec_elem;
          iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar15,&local_478);
          if (iVar8 == 0) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)pcVar15,1e-100);
          }
        }
      }
      local_440 = uVar14 + 1;
    } while (local_440 != local_3b0);
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveLright2(
   R* vec, int* ridx, int& rn, R eps,
   R* vec2, int* ridx2, int& rn2, R eps2)
{
   int i, j, k, n;
   int end;
   R x, x2;
   R* lval, *val;
   int* lrow, *lidx, *idx;
   int* lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   // loop through columns of L
   for(i = 0; i < end; ++i)
   {
      j = lrow[i];
      x2 = vec2[j];
      x = vec[j];

      // check whether there is a corresponding value in the first rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
      if(isNotZero(x, eps))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         // check whether there is  also a corresponding value in the second rhs VectorBase<R>; skipping/ignoring FACTOR_MARKER
         if(isNotZero(x2, eps2))
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
               ++val;
            }
         }
         // only the first VectorBase<R> needs to be modified
         else
         {
            for(j = lbeg[i + 1]; j > k; --j)
            {
               assert(*idx >= 0 && *idx < thedim);
               n = *idx++;
               updateSolutionVectorLright(x * (*val), n, vec[n], ridx, rn);
               ++val;
            }
         }
      }
      // only the second VectorBase<R> needs to be modified
      else if(isNotZero(x2, eps2))
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            n = *idx++;
            updateSolutionVectorLright(x2 * (*val), n, vec2[n], ridx2, rn2);
            ++val;
         }
      }
   }

   if(l.updateType)                     /* Forest-Tomlin Updates */
   {
      end = l.firstUnused;

      for(; i < end; ++i)
      {
         k = lbeg[i];
         idx = &(lidx[k]);
         val = &(lval[k]);

         StableSum<R> tmp1, tmp2;

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            tmp1 += vec[*idx] * (*val);
            tmp2 += vec2[*idx++] * (*val++);
         }

         x = R(tmp1);
         x2 = R(tmp2);

         j = lrow[i];

         if(isNotZero(x, eps))
            updateSolutionVectorLright(x, j, vec[j], ridx, rn);

         if(isNotZero(x2, eps2))
            updateSolutionVectorLright(x2, j, vec2[j], ridx2, rn2);
      }
   }
}